

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraints.c
# Opt level: O0

int asn_check_constraints
              (asn_TYPE_descriptor_t *type_descriptor,void *struct_ptr,char *errbuf,size_t *errlen)

{
  int iVar1;
  undefined8 *in_RCX;
  undefined8 in_RSI;
  long in_RDI;
  int ret;
  errbufDesc arg;
  undefined8 local_50;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_28;
  undefined8 *local_20;
  
  local_40 = 0;
  local_38 = 0;
  if (in_RCX == (undefined8 *)0x0) {
    local_50 = 0;
  }
  else {
    local_50 = *in_RCX;
  }
  local_28 = local_50;
  local_20 = in_RCX;
  iVar1 = (**(code **)(in_RDI + 0x20))(in_RDI,in_RSI,_asn_i_ctfailcb,&local_40);
  if ((iVar1 == -1) && (local_20 != (undefined8 *)0x0)) {
    *local_20 = local_28;
  }
  return iVar1;
}

Assistant:

int
asn_check_constraints(asn_TYPE_descriptor_t *type_descriptor,
		const void *struct_ptr, char *errbuf, size_t *errlen) {
	struct errbufDesc arg;
	int ret;

	arg.failed_type = 0;
	arg.failed_struct_ptr = 0;
	arg.errbuf = errbuf;
	arg.errlen = errlen ? *errlen : 0;

	ret = type_descriptor->check_constraints(type_descriptor,
		struct_ptr, _asn_i_ctfailcb, &arg);
	if(ret == -1 && errlen)
		*errlen = arg.errlen;

	return ret;
}